

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O3

int mbedtls_ripemd160_self_test(int verbose)

{
  undefined4 uVar1;
  uchar *input;
  size_t ilen;
  ulong uVar2;
  long lVar3;
  uchar (*pauVar4) [20];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uchar output [20];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  uVar2 = 1;
  pauVar4 = ripemd160_test_md;
  lVar3 = 0;
  do {
    if (verbose != 0) {
      printf("  RIPEMD-160 test #%d: ",uVar2);
    }
    input = *(uchar **)((long)ripemd160_test_input + lVar3);
    ilen = strlen((char *)input);
    mbedtls_ripemd160(input,ilen,local_48);
    uVar1 = *(undefined4 *)(*pauVar4 + 0x10);
    auVar5[0] = -((*pauVar4)[0] == local_48[0]);
    auVar5[1] = -((*pauVar4)[1] == local_48[1]);
    auVar5[2] = -((*pauVar4)[2] == local_48[2]);
    auVar5[3] = -((*pauVar4)[3] == local_48[3]);
    auVar5[4] = -((*pauVar4)[4] == local_48[4]);
    auVar5[5] = -((*pauVar4)[5] == local_48[5]);
    auVar5[6] = -((*pauVar4)[6] == local_48[6]);
    auVar5[7] = -((*pauVar4)[7] == local_48[7]);
    auVar5[8] = -((*pauVar4)[8] == local_48[8]);
    auVar5[9] = -((*pauVar4)[9] == local_48[9]);
    auVar5[10] = -((*pauVar4)[10] == local_48[10]);
    auVar5[0xb] = -((*pauVar4)[0xb] == local_48[0xb]);
    auVar5[0xc] = -((*pauVar4)[0xc] == local_48[0xc]);
    auVar5[0xd] = -((*pauVar4)[0xd] == local_48[0xd]);
    auVar5[0xe] = -((*pauVar4)[0xe] == local_48[0xe]);
    auVar5[0xf] = -((*pauVar4)[0xf] == local_48[0xf]);
    auVar6[0] = -((char)uVar1 == (char)local_38);
    auVar6[1] = -((char)((uint)uVar1 >> 8) == (char)((uint)local_38 >> 8));
    auVar6[2] = -((char)((uint)uVar1 >> 0x10) == (char)((uint)local_38 >> 0x10));
    auVar6[3] = -((char)((uint)uVar1 >> 0x18) == (char)((uint)local_38 >> 0x18));
    auVar6[4] = 0xff;
    auVar6[5] = 0xff;
    auVar6[6] = 0xff;
    auVar6[7] = 0xff;
    auVar6[8] = 0xff;
    auVar6[9] = 0xff;
    auVar6[10] = 0xff;
    auVar6[0xb] = 0xff;
    auVar6[0xc] = 0xff;
    auVar6[0xd] = 0xff;
    auVar6[0xe] = 0xff;
    auVar6[0xf] = 0xff;
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) {
      if (verbose == 0) {
        return 1;
      }
      puts("failed");
      return 1;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    pauVar4 = pauVar4 + 1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  return 0;
}

Assistant:

int mbedtls_ripemd160_self_test( int verbose )
{
    int i;
    unsigned char output[20];

    memset( output, 0, sizeof output );

    for( i = 0; i < TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  RIPEMD-160 test #%d: ", i + 1 );

        mbedtls_ripemd160( (const unsigned char *) ripemd160_test_input[i],
                   strlen( ripemd160_test_input[i] ),
                   output );

        if( memcmp( output, ripemd160_test_md[i], 20 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    return( 0 );
}